

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O1

void __thiscall
YAJLScan::YAJLScan(YAJLScan *this,YAJLMiscData *misc,YAJLFrameHeader *fheader,bitio_stream *bstream)

{
  undefined8 *puVar1;
  byte bVar2;
  bitio_stream *pbVar3;
  bitio_stream *pbVar4;
  pointer pYVar5;
  pointer pMVar6;
  pointer pYVar7;
  long lVar8;
  ulong uVar9;
  ssize_t sVar10;
  undefined8 extraout_RAX;
  uint uVar11;
  uint uVar12;
  YAJLFrameHeader *extraout_RDX;
  YAJLFrameHeader *extraout_RDX_00;
  YAJLFrameHeader *extraout_RDX_01;
  YAJLFrameHeader *extraout_RDX_02;
  void *__buf;
  YAJLFrameHeader *extraout_RDX_03;
  ulong uVar13;
  float fVar14;
  YAJLScan *this_00;
  bool bVar15;
  int iVar16;
  ulong uVar17;
  float fVar18;
  YAJLScan *local_90;
  float local_84;
  YAJLFrameHeader *local_80;
  float local_74;
  vector<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_> *local_70;
  YAJLMiscData *local_68;
  pointer local_60;
  YAJLScanHeader local_58;
  
  lVar8 = 0x48;
  do {
    puVar1 = (undefined8 *)((long)&(this->tables).qtables[0].coeffs + lVar8);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x108);
  local_70 = &(this->header).specs;
  (this->header).specs.super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->header).specs.super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->header).specs.super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mcus).super__Vector_base<YAJLScan::MCU,_std::allocator<YAJLScan::MCU>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mcus).super__Vector_base<YAJLScan::MCU,_std::allocator<YAJLScan::MCU>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mcus).super__Vector_base<YAJLScan::MCU,_std::allocator<YAJLScan::MCU>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar15 = true;
  local_90 = (YAJLScan *)bstream;
  local_80 = fheader;
  local_68 = misc;
  do {
    this_00 = local_90;
    uVar9 = bitio::bitio_stream::read((bitio_stream *)local_90,0x10,fheader,(size_t)bstream);
    uVar11 = (uint)uVar9 & 0xfff0;
    bstream = (bitio_stream *)(ulong)uVar11;
    if ((short)uVar11 == -0x20) {
      YAJLMiscData::fetch_app_data(misc,(bitio_stream *)local_90);
      fheader = extraout_RDX;
    }
    else if ((u16)uVar9 == 0xffdb) {
      YAJLTables::fetch_qtable(&this->tables,(bitio_stream *)local_90);
      fheader = extraout_RDX_01;
    }
    else {
      bstream = (bitio_stream *)(uVar9 & 0xffff);
      if ((int)bstream == 0xfffe) {
        YAJLMiscData::fetch_comment(misc,(bitio_stream *)local_90);
        fheader = extraout_RDX_00;
      }
      else if (((uint)uVar9 & 0xfff7) == 0xffc4) {
        YAJLTables::fetch_etable(&this->tables,(u16)uVar9,(bitio_stream *)local_90);
        fheader = extraout_RDX_02;
      }
      else {
        if ((int)bstream != 0xffda) {
          YAJLScan(this_00);
          pMVar6 = (this->mcus).super__Vector_base<YAJLScan::MCU,_std::allocator<YAJLScan::MCU>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (pMVar6 != (pointer)0x0) {
            operator_delete(pMVar6,(long)(this->mcus).
                                         super__Vector_base<YAJLScan::MCU,_std::allocator<YAJLScan::MCU>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pMVar6);
          }
          pYVar7 = (local_70->
                   super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (pYVar7 != (pointer)0x0) {
            operator_delete(pYVar7,(long)(this->header).specs.
                                         super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pYVar7);
          }
          _Unwind_Resume(extraout_RAX);
        }
        YAJLScanHeader::YAJLScanHeader(&local_58,(bitio_stream *)local_90);
        (this->header).ncomponents = local_58.ncomponents;
        std::vector<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>::_M_move_assign
                  (local_70);
        (this->header).select_start = local_58.select_start;
        (this->header).select_end = local_58.select_end;
        (this->header).ah = local_58.ah;
        (this->header).al = local_58.al;
        if (local_58.specs.
            super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_58.specs.
                          super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_58.specs.
                                super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_58.specs.
                                super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        pbVar3 = (bitio_stream *)
                 (local_80->specs).
                 super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pbVar4 = (bitio_stream *)
                 (local_80->specs).
                 super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (pbVar3 == pbVar4) {
          fVar18 = 0.0;
        }
        else {
          uVar11 = 0;
          bstream = pbVar3;
          do {
            uVar12 = uVar11 & 0xff;
            uVar11 = (uint)*(byte *)((long)&bstream->file + 2) *
                     (uint)*(byte *)((long)&bstream->file + 1);
            if (uVar11 <= uVar12) {
              uVar11 = uVar12;
            }
            bstream = (bitio_stream *)((long)&bstream->file + 4);
          } while (bstream != pbVar4);
          fVar18 = (float)((uVar11 & 0xff) << 6);
        }
        uVar9 = (ulong)(this->header).ncomponents;
        if (uVar9 == 0) {
          fVar18 = 0.0;
        }
        else {
          local_74 = (float)(int)((uint)local_80->nsamples_per_line * (uint)local_80->nlines);
          uVar17 = 0;
          uVar13 = 0;
          local_84 = fVar18;
          do {
            uVar11 = (uint)*(byte *)((long)&pbVar3->file + uVar17 * 4 + 2) *
                     (uint)*(byte *)((long)&pbVar3->file + uVar17 * 4 + 1);
            bstream = (bitio_stream *)(ulong)uVar11;
            fVar18 = ceilf(((float)uVar11 * local_74) / local_84);
            uVar13 = (ulong)((float)(uVar13 & 0xffffffff) + fVar18);
            fVar18 = (float)uVar13;
            uVar17 = uVar17 + 1;
          } while (uVar9 != uVar17);
        }
        if (fVar18 != 0.0) {
          uVar9 = 0;
          fVar14 = 0.0;
          do {
            uVar13 = (ulong)(this->header).specs.
                            super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>
                            ._M_impl.super__Vector_impl_data._M_start[(int)uVar9].component_selector
            ;
            pYVar5 = (local_80->specs).
                     super__Vector_base<YAJLFrameHeaderSpec,_std::allocator<YAJLFrameHeaderSpec>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            iVar16 = (uint)pYVar5[uVar13 - 1].vertical_sampling_factor *
                     (uint)pYVar5[uVar13 - 1].horizontal_sampling_factor;
            if (iVar16 != 0) {
              local_84 = (float)((int)fVar14 + iVar16);
              do {
                local_60 = (this->header).specs.
                           super__Vector_base<YAJLScanHeaderSpec,_std::allocator<YAJLScanHeaderSpec>_>
                           ._M_impl.super__Vector_impl_data._M_start + (uVar13 - 1);
                local_58._0_8_ = this;
                std::vector<YAJLScan::MCU,std::allocator<YAJLScan::MCU>>::
                emplace_back<bitio::bitio_stream*&,YAJLTables*,YAJLScanHeaderSpec*>
                          ((vector<YAJLScan::MCU,std::allocator<YAJLScan::MCU>> *)&this->mcus,
                           (bitio_stream **)&local_90,(YAJLTables **)&local_58,&local_60);
                iVar16 = iVar16 + -1;
                fVar14 = local_84;
              } while (iVar16 != 0);
            }
            bVar2 = (this->header).ncomponents;
            bstream = (bitio_stream *)(ulong)bVar2;
            uVar9 = (long)((int)uVar9 + 1) % (long)(int)(uint)bVar2 & 0xffffffff;
          } while ((uint)fVar14 < (uint)fVar18);
        }
        bitio::bitio_stream::force_align((bitio_stream *)local_90);
        sVar10 = bitio::bitio_stream::read((bitio_stream *)local_90,0x10,__buf,(size_t)bstream);
        bVar15 = false;
        printf("%x\n",sVar10);
        printf("Run completed at: %s for \'Scan\'\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/frame.cpp"
              );
        fheader = extraout_RDX_03;
        misc = local_68;
      }
    }
  } while (bVar15);
  return;
}

Assistant:

YAJLScan::YAJLScan(YAJLMiscData *misc, YAJLFrameHeader *fheader, bitio::bitio_stream *bstream) {
    // we fill YAJLScan with data fetch directly over bitio streams.
    bool run = true;
    while (run) {
        u16 marker = bstream->read(0x10);
        // since we are inside a Scan, we don't need to handle SOF markers
        if (markers::is_app_marker(marker)) {
            misc->fetch_app_data(bstream);
        } else if (marker == markers::COM) {
            misc->fetch_comment(bstream);
        } else if (marker == markers::DQT) {
            tables.fetch_qtable(bstream);
        } else if (marker == markers::DHT || marker == markers::DAC) {
            tables.fetch_etable(marker, bstream);
        } else if (marker == markers::SOS) {
            header = YAJLScanHeader(bstream);
            // scan for MCUs here
            // if Ns > 1, then the MCUs are interleaved. refer B.2.3 from ISO 10918
            // the interleaved components are ordered in this fashion: Cs1, Cs2 ... Csj

            int index = 0;
            u32 mcu_count = 0;
            u32 mcu_max_count = 0;
            u8 max_sampling_factor = 0;
            for (auto spec : fheader->specs) {
                auto sfactor = spec.horizontal_sampling_factor * spec.vertical_sampling_factor;
                if (max_sampling_factor < sfactor) {
                    max_sampling_factor = sfactor;
                }
            }

            for (int i = 0; i < header.ncomponents; i++) {
                auto sampling_factor = fheader->specs[i].horizontal_sampling_factor * fheader->specs[i].vertical_sampling_factor;
                mcu_max_count += ceil((float) (fheader->nlines * fheader->nsamples_per_line) * sampling_factor / (64 * max_sampling_factor));
            }

            while (mcu_count < mcu_max_count) {

                auto cmp_id = header.specs[index].component_selector - 1;
                auto fspec = fheader->specs[cmp_id];
                for (int r = 0; r < fspec.vertical_sampling_factor * fspec.horizontal_sampling_factor; r++) {
                    mcus.emplace_back(bstream, &tables, &header.specs[cmp_id]);
                    mcu_count++;
                }
                index = (index + 1) % header.ncomponents;
            }

            bstream->force_align();
            printf("%x\n", bstream->read(0x10));

#ifdef DEBUG
            printf("Run completed at: %s for 'Scan'\n", __FILE__);
#endif
            run = false;
        } else {
            fprintf(stderr, "Unhandled marker at: %s\n", __FILE__);
            exit(1);
        }
    }
}